

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

double __thiscall cmCTestRunTest::ResolveTimeout(cmCTestRunTest *this)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  cmCTest *this_00;
  bool bVar4;
  tm *ptVar5;
  time_t tVar6;
  time_t tVar7;
  ostream *poVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  time_t current_time;
  char *local_5d0 [4];
  ostringstream cmCTestLog_msg;
  char buf [1024];
  
  dVar1 = this->TestProperties->Timeout;
  std::__cxx11::string::string((string *)buf,(string *)&this->CTest->StopTime);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                          "");
  std::__cxx11::string::~string((string *)buf);
  dVar12 = dVar1;
  if (!bVar4) {
    current_time = time((time_t *)0x0);
    ptVar5 = gmtime(&current_time);
    iVar11 = ptVar5->tm_hour;
    tVar6 = mktime(ptVar5);
    ptVar5 = localtime(&current_time);
    iVar2 = ptVar5->tm_hour;
    iVar9 = iVar2 - iVar11;
    if ((iVar9 == 0 || iVar2 < iVar11) || tVar6 <= current_time) {
      iVar10 = iVar9 + 0x18;
      if (iVar11 <= iVar2) {
        iVar10 = iVar9;
      }
      if (current_time <= tVar6) {
        iVar10 = iVar9;
      }
    }
    else {
      iVar10 = iVar9 + -0x18;
    }
    iVar11 = ptVar5->tm_year;
    uVar3 = ptVar5->tm_mday;
    iVar2 = ptVar5->tm_mon;
    std::__cxx11::string::string((string *)&cmCTestLog_msg,(string *)&this->CTest->StopTime);
    sprintf(buf,"%d%02d%02d %s %+05i",(ulong)(iVar11 + 0x76c),(ulong)(iVar2 + 1),(ulong)uVar3,
            _cmCTestLog_msg,iVar10 * 100);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    tVar7 = curl_getdate(buf,&current_time);
    if (tVar7 != -1) {
      iVar11 = (int)tVar7 + 0x15180;
      if (this->CTest->NextDayStopTime == false) {
        iVar11 = (int)tVar7;
      }
      iVar11 = (iVar11 - (int)current_time) % 0x15180;
      this->CTest->LastStopTimeout = iVar11;
      if (iVar11 < 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "The stop time has been passed. Stopping all tests.");
        std::endl<char,std::char_traits<char>>(poVar8);
        this_00 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x298,local_5d0[0],false);
        std::__cxx11::string::~string((string *)local_5d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        this->StopTimePassed = true;
        dVar12 = 0.0;
      }
      else {
        dVar13 = (double)iVar11;
        if (((dVar1 != 0.0) || (dVar12 = dVar13, NAN(dVar1))) && (dVar12 = dVar1, dVar13 <= dVar1))
        {
          dVar12 = dVar13;
        }
      }
    }
  }
  return dVar12;
}

Assistant:

double cmCTestRunTest::ResolveTimeout()
{
  double timeout = this->TestProperties->Timeout;

  if (this->CTest->GetStopTime() == "") {
    return timeout;
  }
  struct tm* lctime;
  time_t current_time = time(CM_NULLPTR);
  lctime = gmtime(&current_time);
  int gm_hour = lctime->tm_hour;
  time_t gm_time = mktime(lctime);
  lctime = localtime(&current_time);
  int local_hour = lctime->tm_hour;

  int tzone_offset = local_hour - gm_hour;
  if (gm_time > current_time && gm_hour < local_hour) {
    // this means gm_time is on the next day
    tzone_offset -= 24;
  } else if (gm_time < current_time && gm_hour > local_hour) {
    // this means gm_time is on the previous day
    tzone_offset += 24;
  }

  tzone_offset *= 100;
  char buf[1024];
  // add todays year day and month to the time in str because
  // curl_getdate no longer assumes the day is today
  sprintf(buf, "%d%02d%02d %s %+05i", lctime->tm_year + 1900,
          lctime->tm_mon + 1, lctime->tm_mday,
          this->CTest->GetStopTime().c_str(), tzone_offset);

  time_t stop_time = curl_getdate(buf, &current_time);
  if (stop_time == -1) {
    return timeout;
  }

  // the stop time refers to the next day
  if (this->CTest->NextDayStopTime) {
    stop_time += 24 * 60 * 60;
  }
  int stop_timeout =
    static_cast<int>(stop_time - current_time) % (24 * 60 * 60);
  this->CTest->LastStopTimeout = stop_timeout;

  if (stop_timeout <= 0 || stop_timeout > this->CTest->LastStopTimeout) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "The stop time has been passed. "
                                           "Stopping all tests."
                 << std::endl);
    this->StopTimePassed = true;
    return 0;
  }
  return timeout == 0 ? stop_timeout
                      : (timeout < stop_timeout ? timeout : stop_timeout);
}